

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *in_R8;
  uint in_R9D;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m_ac;
  __m128i m_i0;
  int i;
  __m128i zeros;
  __m128i one_b;
  __m128i v_maxval;
  int in_stack_000000f0;
  int local_11c;
  ulong uStack_110;
  CONV_BUF_TYPE *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  __m128i *local_a8;
  __m128i *palStack_a0;
  undefined8 local_58;
  __m128i *palStack_50;
  
  auVar3 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar3 = vpinsrw_avx(auVar3,0x40,2);
  auVar3 = vpinsrw_avx(auVar3,0x40,3);
  auVar3 = vpinsrw_avx(auVar3,0x40,4);
  auVar3 = vpinsrw_avx(auVar3,0x40,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  auVar3 = vpinsrw_avx(auVar3,0x40,7);
  local_a8 = auVar3._0_8_;
  palStack_a0 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar3 = vpinsrb_avx(auVar3,1,2);
  auVar3 = vpinsrb_avx(auVar3,1,3);
  auVar3 = vpinsrb_avx(auVar3,1,4);
  auVar3 = vpinsrb_avx(auVar3,1,5);
  auVar3 = vpinsrb_avx(auVar3,1,6);
  auVar3 = vpinsrb_avx(auVar3,1,7);
  auVar3 = vpinsrb_avx(auVar3,1,8);
  auVar3 = vpinsrb_avx(auVar3,1,9);
  auVar3 = vpinsrb_avx(auVar3,1,10);
  auVar3 = vpinsrb_avx(auVar3,1,0xb);
  auVar3 = vpinsrb_avx(auVar3,1,0xc);
  auVar3 = vpinsrb_avx(auVar3,1,0xd);
  auVar3 = vpinsrb_avx(auVar3,1,0xe);
  auVar3 = vpinsrb_avx(auVar3,1,0xf);
  local_58 = auVar3._0_8_;
  palStack_50 = auVar3._8_8_;
  auVar4 = ZEXT1664(ZEXT816(0) << 0x20);
  for (local_11c = 0; auVar3 = auVar4._0_16_, local_11c < (int)m[1]; local_11c = local_11c + 1) {
    xx_loadu_128(in_stack_00000008);
    auVar1._8_8_ = palStack_50;
    auVar1._0_8_ = local_58;
    auVar3 = vpmaddubsw_avx(auVar3,auVar1);
    uStack_110 = SUB168(ZEXT816(0),4);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uStack_110;
    auVar3 = vpavgw_avx(auVar3,auVar2 << 0x40);
    auVar4 = ZEXT1664(auVar3);
    blend_a64_d16_mask_w8_sse41
              (in_R8,(CONV_BUF_TYPE *)CONCAT44(in_R9D,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,palStack_a0,local_a8,palStack_50,in_stack_000000f0);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)m[0]);
    in_R8 = in_R8 + (ulong)in_R9D * 2;
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i zeros = _mm_setzero_si128();
  for (int i = 0; i < h; ++i) {
    const __m128i m_i0 = xx_loadu_128(mask);
    const __m128i m_ac = _mm_maddubs_epi16(m_i0, one_b);
    const __m128i m = _mm_avg_epu16(m_ac, zeros);

    blend_a64_d16_mask_w8_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}